

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  float *pfVar2;
  uchar *__ptr;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  float *pfVar8;
  ulong uVar9;
  stbi__result_info *in_R9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uchar *puVar13;
  ulong uVar14;
  long *in_FS_OFFSET;
  bool bVar15;
  float fVar16;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    piVar6 = comp;
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      pcVar4 = "Image not of any known type, or corrupt";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar2 = (float *)stbi__malloc_mad4(a,b,req_comp,(int)piVar6,iVar1);
      if (pfVar2 != (float *)0x0) {
        uVar9 = 0;
        uVar5 = req_comp - (uint)((req_comp & 1U) == 0);
        uVar10 = b * a;
        uVar14 = 0;
        if (0 < (int)uVar5) {
          uVar14 = (ulong)uVar5;
        }
        lVar7 = (long)req_comp;
        pfVar8 = pfVar2;
        puVar13 = __ptr;
        uVar11 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar11 = uVar9;
        }
        for (; uVar9 != uVar11; uVar9 = uVar9 + 1) {
          for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
            fVar16 = powf((float)puVar13[uVar12] / 255.0,stbi__l2h_gamma);
            pfVar8[uVar12] = fVar16 * stbi__l2h_scale;
          }
          pfVar8 = pfVar8 + lVar7;
          puVar13 = puVar13 + lVar7;
        }
        if ((req_comp & 1U) == 0) {
          lVar3 = (long)(int)uVar5;
          while (bVar15 = uVar11 != 0, uVar11 = uVar11 - 1, bVar15) {
            pfVar2[lVar3] = (float)__ptr[lVar3] / 255.0;
            lVar3 = lVar3 + lVar7;
          }
        }
        free(__ptr);
        return pfVar2;
      }
      free(__ptr);
      pcVar4 = "Out of memory";
    }
    in_FS_OFFSET[-2] = (long)pcVar4;
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if (pfVar2 != (float *)0x0) {
      piVar6 = &stbi__vertically_flip_on_load_global;
      if (*(int *)((long)in_FS_OFFSET + -4) != 0) {
        piVar6 = (int *)(*in_FS_OFFSET + -8);
      }
      if (*piVar6 != 0) {
        if (req_comp == 0) {
          req_comp = *comp;
        }
        stbi__vertical_flip(pfVar2,*x,*y,req_comp << 2);
      }
    }
  }
  return pfVar2;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}